

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallIndirect(TranslateToFuzzReader *this,Type type)

{
  size_t *this_00;
  Module *pMVar1;
  bool bVar2;
  Index IVar3;
  size_type sVar4;
  pointer pEVar5;
  reference ppEVar6;
  ulong uVar7;
  long lVar8;
  Iterator IVar9;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  Name NVar11;
  Name NVar12;
  byte local_172;
  bool local_171;
  Expression *local_140;
  uintptr_t *local_138;
  Type *type_1;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Literal local_c8;
  Const *local_b0;
  Expression *target;
  char *local_a0;
  Type local_98;
  Type addressType;
  Type local_88;
  Type local_80;
  Type local_78;
  BasicType local_6c;
  char *local_68;
  char *local_60;
  RefFunc *local_58;
  RefFunc *get;
  Function *pFStack_48;
  bool isReturn;
  Function *targetFn;
  Index i;
  Index start;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *local_30;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *data;
  value_type *randomElem;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  pMVar1 = this->wasm;
  randomElem = (value_type *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  sVar4 = std::
          vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ::size((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  *)(this->wasm + 0x60));
  IVar3 = upTo(this,(Index)sVar4);
  data = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
         std::
         vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ::operator[]((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                       *)(pMVar1 + 0x60),(ulong)IVar3);
  pEVar5 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)data);
  local_30 = &pEVar5->data;
  bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty(local_30);
  if (bVar2) {
    _i = this_local;
    type_local.id = (uintptr_t)make(this,(Type)this_local);
  }
  else {
    sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(local_30);
    targetFn._0_4_ = upTo(this,(Index)sVar4);
    targetFn._4_4_ = (uint)targetFn;
    do {
      ppEVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (local_30,(ulong)(uint)targetFn);
      local_58 = Expression::dynCast<wasm::RefFunc>(*ppEVar6);
      if (local_58 != (RefFunc *)0x0) {
        local_68 = (char *)(local_58->func).super_IString.str._M_len;
        local_60 = (local_58->func).super_IString.str._M_str;
        NVar11.super_IString.str._M_str = local_68;
        NVar11.super_IString.str._M_len = (size_t)this->wasm;
        pFStack_48 = (Function *)wasm::Module::getFunction(NVar11);
        local_6c = unreachable;
        bVar2 = Type::operator==((Type *)&this_local,&local_6c);
        local_171 = false;
        if (bVar2) {
          bVar2 = FeatureSet::hasTailCall((FeatureSet *)(this->wasm + 0x178));
          local_171 = false;
          if (bVar2) {
            local_78 = Function::getResults(this->funcContext->func);
            local_80 = Function::getResults(pFStack_48);
            local_171 = Type::operator==(&local_78,&local_80);
          }
        }
        get._7_1_ = local_171;
        local_88 = Function::getResults(pFStack_48);
        bVar2 = Type::operator==(&local_88,(Type *)&this_local);
        local_172 = 1;
        if (!bVar2) {
          local_172 = get._7_1_;
        }
        if ((local_172 & 1) != 0) {
          target = (Expression *)(this->funcrefTableName).super_IString.str._M_len;
          local_a0 = (this->funcrefTableName).super_IString.str._M_str;
          NVar12.super_IString.str._M_str = (char *)target;
          NVar12.super_IString.str._M_len = (size_t)this->wasm;
          lVar8 = wasm::Module::getTable(NVar12);
          local_98.id = *(uintptr_t *)(lVar8 + 0x48);
          if (((this->allowOOB & 1U) == 0) || (bVar2 = oneIn(this,10), !bVar2)) {
            Literal::makeFromInt32(&local_c8,(uint)targetFn,local_98);
            local_b0 = Builder::makeConst(&this->builder,&local_c8);
            wasm::Literal::~Literal(&local_c8);
          }
          else {
            args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)local_98.id;
            local_b0 = (Const *)make(this,local_98);
          }
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)Function::getParams(pFStack_48);
          this_00 = &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
          IVar9 = Type::begin((Type *)this_00);
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)IVar9.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index;
          __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)IVar9.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent;
          PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   Type::end((Type *)this_00);
          while( true ) {
            __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)PVar10.index;
            type_1 = PVar10.parent;
            bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                               &__end1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       *)&type_1);
            if (!bVar2) break;
            local_138 = (uintptr_t *)
                        wasm::Type::Iterator::operator*
                                  ((Iterator *)
                                   &__end1.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index);
            local_140 = make(this,(Type)*local_138);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1,
                       &local_140);
            ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index);
            PVar10.index = (size_t)__end1.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent;
            PVar10.parent = type_1;
          }
          type_local.id =
               (uintptr_t)
               Builder::
               makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,(Name)(this->funcrefTableName).super_IString.str,
                          (Expression *)local_b0,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          &__range1,(pFStack_48->type).id,(bool)(get._7_1_ & 1));
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
          return (Expression *)type_local.id;
        }
      }
      targetFn._0_4_ = (uint)targetFn + 1;
      uVar7 = (ulong)(uint)targetFn;
      sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(local_30);
      if (uVar7 == sVar4) {
        targetFn._0_4_ = 0;
      }
    } while ((uint)targetFn != targetFn._4_4_);
    addressType.id = (uintptr_t)this_local;
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallIndirect(Type type) {
  auto& randomElem = wasm.elementSegments[upTo(wasm.elementSegments.size())];
  auto& data = randomElem->data;
  if (data.empty()) {
    return make(type);
  }
  // look for a call target with the right type
  Index start = upTo(data.size());
  Index i = start;
  Function* targetFn;
  bool isReturn;
  while (1) {
    // TODO: handle unreachable
    if (auto* get = data[i]->dynCast<RefFunc>()) {
      targetFn = wasm.getFunction(get->func);
      isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
                 funcContext->func->getResults() == targetFn->getResults();
      if (targetFn->getResults() == type || isReturn) {
        break;
      }
    }
    i++;
    if (i == data.size()) {
      i = 0;
    }
    if (i == start) {
      return makeTrivial(type);
    }
  }
  // with high probability, make sure the type is valid - otherwise, most are
  // going to trap
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  Expression* target;
  if (!allowOOB || !oneIn(10)) {
    target = builder.makeConst(Literal::makeFromInt32(i, addressType));
  } else {
    target = make(addressType);
  }
  std::vector<Expression*> args;
  for (const auto& type : targetFn->getParams()) {
    args.push_back(make(type));
  }
  // TODO: use a random table
  return builder.makeCallIndirect(
    funcrefTableName, target, args, targetFn->type, isReturn);
}